

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

void Pdr_OblDeref(Pdr_Obl_t *p)

{
  int *piVar1;
  
  piVar1 = &p->nRefs;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (p->pNext != (Pdr_Obl_t *)0x0) {
    Pdr_OblDeref(p->pNext);
  }
  Pdr_SetDeref(p->pState);
  free(p);
  return;
}

Assistant:

void Pdr_OblDeref( Pdr_Obl_t * p )
{
    if ( --p->nRefs == 0 )
    {
        if ( p->pNext )
            Pdr_OblDeref( p->pNext );
        Pdr_SetDeref( p->pState );
        ABC_FREE( p );
    }
}